

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_varbuff_get_length(uchar *bytes,size_t bytes_len,size_t *written)

{
  size_t sVar1;
  size_t *written_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((bytes != (uchar *)0x0) == (bytes_len != 0)) && (written != (size_t *)0x0)) {
    sVar1 = varint_get_length(bytes_len);
    *written = sVar1 + bytes_len;
    bytes_local._4_4_ = 0;
  }
  else {
    bytes_local._4_4_ = -2;
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_varbuff_get_length(const unsigned char *bytes, size_t bytes_len, size_t *written)
{
    if (written)
        *written = 0;
    if (BYTES_INVALID(bytes, bytes_len) || !written)
        return WALLY_EINVAL;
    *written = varint_get_length(bytes_len) + bytes_len;
    return WALLY_OK;
}